

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LatticeCreator.hpp
# Opt level: O2

void __thiscall
OpenMD::LatticeBuilder<OpenMD::FCCLattice>::~LatticeBuilder
          (LatticeBuilder<OpenMD::FCCLattice> *this)

{
  LatticeCreator::~LatticeCreator(&this->super_LatticeCreator);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual Lattice* create() const { return new ConcreteLattice(); }